

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_entry.cc
# Opt level: O3

list_entry * raptor_list_pop_front(list_entry *head)

{
  list_entry *plVar1;
  list_entry *plVar2;
  
  plVar1 = head->next;
  if (plVar1 != head) {
    plVar2 = plVar1->next;
    head->next = plVar2;
    plVar2->prev = head;
    return plVar1;
  }
  return (list_entry *)0x0;
}

Assistant:

list_entry* raptor_list_pop_front(list_entry* head) {
    list_entry* second = 0;
    list_entry* removed = 0;
    if (RAPTOR_LIST_IS_EMPTY(head)) {
        return 0;
    }

    removed = head->next;
    second = removed->next;

    head->next = second;
    second->prev = head;
    return removed;
}